

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O0

void block_variance_16x16_dual
               (uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,int w,int h,uint *sse,
               int *sum,int block_size,uint32_t *sse16x16,uint32_t *var16x16)

{
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  uint *in_stack_00000008;
  int col;
  int row;
  int k;
  int local_38;
  int local_34;
  int local_30;
  
  local_30 = 0;
  *in_stack_00000008 = 0;
  *_col = 0;
  for (local_34 = 0; local_34 < in_R9D; local_34 = k + local_34) {
    for (local_38 = 0; local_38 < in_R8D; local_38 = local_38 + 0x20) {
      (*aom_get_var_sse_sum_16x16_dual)
                ((uint8_t *)(in_RDI + in_ESI * local_34 + (long)local_38),in_ESI,
                 (uint8_t *)(in_RDX + in_ECX * local_34 + (long)local_38),in_ECX,
                 (uint32_t *)(CONCAT44(ref_stride,w) + (long)local_30 * 4),in_stack_00000008,_col,
                 (uint32_t *)(ref + (long)local_30 * 4));
      local_30 = local_30 + 2;
    }
  }
  return;
}

Assistant:

static void block_variance_16x16_dual(const uint8_t *src, int src_stride,
                                      const uint8_t *ref, int ref_stride, int w,
                                      int h, unsigned int *sse, int *sum,
                                      int block_size, uint32_t *sse16x16,
                                      uint32_t *var16x16) {
  int k = 0;
  *sse = 0;
  *sum = 0;
  // This function is called for block sizes >= BLOCK_32x32. As per the design
  // the aom_get_var_sse_sum_16x16_dual() processes four 16x16 blocks (in a
  // 16x32) per call. Hence the width and height of the block need to be at
  // least 16 and 32 samples respectively.
  assert(w >= 32);
  assert(h >= 16);
  for (int row = 0; row < h; row += block_size) {
    for (int col = 0; col < w; col += 32) {
      aom_get_var_sse_sum_16x16_dual(src + src_stride * row + col, src_stride,
                                     ref + ref_stride * row + col, ref_stride,
                                     &sse16x16[k], sse, sum, &var16x16[k]);
      k += 2;
    }
  }
}